

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_vec3f ma_vec3f_normalize(ma_vec3f v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ma_vec3f mVar8;
  
  fVar4 = v.z;
  fVar1 = v.x;
  fVar3 = v.y;
  fVar2 = fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar7 = 0.0;
  fVar5 = 0.0;
  fVar6 = 0.0;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = 1.0 / fVar2;
    fVar5 = fVar1 * fVar2;
    fVar6 = fVar3 * fVar2;
    fVar7 = fVar2 * fVar4;
  }
  mVar8.y = fVar6;
  mVar8.x = fVar5;
  mVar8.z = fVar7;
  return mVar8;
}

Assistant:

MA_API ma_vec3f ma_vec3f_normalize(ma_vec3f v)
{
    float f;
    float l = ma_vec3f_len(v);
    if (l == 0) {
        return ma_vec3f_init_3f(0, 0, 0);
    }

    f = 1 / l;
    v.x *= f;
    v.y *= f;
    v.z *= f;

    return v;
}